

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O0

word * Abc_NodeConeTruth(Vec_Ptr_t *vVars,Vec_Ptr_t *vFuncs,int nWordsMax,Abc_Obj_t *pRoot,
                        Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVisited)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar5;
  int local_60;
  int nWords;
  int k;
  int i;
  word *pTruth;
  word *pTruth1;
  word *pTruth0;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pRoot_local;
  Vec_Ptr_t *pVStack_18;
  int nWordsMax_local;
  Vec_Ptr_t *vFuncs_local;
  Vec_Ptr_t *vVars_local;
  
  _k = (word *)0x0;
  vLeaves_local = (Vec_Ptr_t *)pRoot;
  pRoot_local._4_4_ = nWordsMax;
  pVStack_18 = vFuncs;
  vFuncs_local = vVars;
  iVar1 = Vec_PtrSize(vLeaves);
  iVar1 = Abc_Truth6WordNum(iVar1);
  Abc_NodeConeCollect((Abc_Obj_t **)&vLeaves_local,1,vLeaves,vVisited,0);
  for (nWords = 0; iVar2 = Vec_PtrSize(vLeaves), nWords < iVar2; nWords = nWords + 1) {
    pvVar3 = Vec_PtrEntry(vLeaves,nWords);
    pvVar4 = Vec_PtrEntry(vFuncs_local,nWords);
    *(void **)((long)pvVar3 + 0x40) = pvVar4;
  }
  for (nWords = Vec_PtrSize(pVStack_18); iVar2 = Vec_PtrSize(vVisited), p = pVStack_18,
      nWords < iVar2; nWords = nWords + 1) {
    pvVar3 = malloc((long)pRoot_local._4_4_ << 3);
    Vec_PtrPush(p,pvVar3);
  }
  nWords = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(vVisited);
    if (iVar2 <= nWords) {
      return _k;
    }
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vVisited,nWords);
    iVar2 = Abc_ObjIsPi(pObj);
    if (iVar2 != 0) break;
    pAVar5 = Abc_ObjFanin0(pObj);
    pvVar3 = (pAVar5->field_6).pTemp;
    pAVar5 = Abc_ObjFanin1(pObj);
    pvVar4 = (pAVar5->field_6).pTemp;
    _k = (word *)Vec_PtrEntry(pVStack_18,nWords);
    iVar2 = Abc_ObjFaninC0(pObj);
    if (iVar2 == 0) {
      iVar2 = Abc_ObjFaninC1(pObj);
      if (iVar2 == 0) {
        for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
          _k[local_60] = *(ulong *)((long)pvVar3 + (long)local_60 * 8) &
                         *(ulong *)((long)pvVar4 + (long)local_60 * 8);
        }
      }
      else {
        for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
          _k[local_60] = *(ulong *)((long)pvVar3 + (long)local_60 * 8) &
                         (*(ulong *)((long)pvVar4 + (long)local_60 * 8) ^ 0xffffffffffffffff);
        }
      }
    }
    else {
      iVar2 = Abc_ObjFaninC1(pObj);
      if (iVar2 == 0) {
        for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
          _k[local_60] = (*(ulong *)((long)pvVar3 + (long)local_60 * 8) ^ 0xffffffffffffffff) &
                         *(ulong *)((long)pvVar4 + (long)local_60 * 8);
        }
      }
      else {
        for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
          _k[local_60] = (*(ulong *)((long)pvVar3 + (long)local_60 * 8) ^ 0xffffffffffffffff) &
                         (*(ulong *)((long)pvVar4 + (long)local_60 * 8) ^ 0xffffffffffffffff);
        }
      }
    }
    (pObj->field_6).pTemp = _k;
    nWords = nWords + 1;
  }
  __assert_fail("!Abc_ObjIsPi(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRefactor.c"
                ,0x61,
                "word *Abc_NodeConeTruth(Vec_Ptr_t *, Vec_Ptr_t *, int, Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

word * Abc_NodeConeTruth( Vec_Ptr_t * vVars, Vec_Ptr_t * vFuncs, int nWordsMax, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited )
{
    Abc_Obj_t * pNode;
    word * pTruth0, * pTruth1, * pTruth = NULL;
    int i, k, nWords = Abc_Truth6WordNum( Vec_PtrSize(vLeaves) );
    // get nodes in the cut without fanins in the DFS order
    Abc_NodeConeCollect( &pRoot, 1, vLeaves, vVisited, 0 );
    // set elementary functions
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vVars, i );
    // prepare functions
    for ( i = Vec_PtrSize(vFuncs); i < Vec_PtrSize(vVisited); i++ )
        Vec_PtrPush( vFuncs, ABC_ALLOC(word, nWordsMax) );
    // compute functions for the collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
    {
        assert( !Abc_ObjIsPi(pNode) );
        pTruth0 = (word *)Abc_ObjFanin0(pNode)->pCopy;
        pTruth1 = (word *)Abc_ObjFanin1(pNode)->pCopy;
        pTruth  = (word *)Vec_PtrEntry( vFuncs, i );
        if ( Abc_ObjFaninC0(pNode) )
        {
            if ( Abc_ObjFaninC1(pNode) )
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] = ~pTruth0[k] & ~pTruth1[k];
            else
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] = ~pTruth0[k] &  pTruth1[k];
        }
        else
        {
            if ( Abc_ObjFaninC1(pNode) )
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] =  pTruth0[k] & ~pTruth1[k];
            else
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] =  pTruth0[k] &  pTruth1[k];
        }
        pNode->pCopy = (Abc_Obj_t *)pTruth;
    }
    return pTruth;
}